

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

uint nullcDebugGetReversedStackDataBase(uint framePos)

{
  uint uVar1;
  ExternFuncInfo *pEVar2;
  ExternFuncInfo *targetFunction;
  ExternFuncInfo *functions;
  uint functionCount;
  uint instruction;
  uint currentFrame;
  uint offset;
  uint targetFrame;
  uint callStackSize;
  uint framePos_local;
  
  targetFrame = framePos;
  offset = nullcDebugGetStackFrameCount();
  if (offset < targetFrame) {
    callStackSize = 0;
  }
  else {
    currentFrame = offset - targetFrame;
    instruction = 0;
    functionCount = 0;
    while( true ) {
      uVar1 = functionCount;
      functionCount = functionCount + 1;
      functions._4_4_ = nullcDebugEnumStackFrame(uVar1);
      if (functions._4_4_ == 0) break;
      if (currentFrame == 0) {
        return instruction;
      }
      currentFrame = currentFrame - 1;
      functions._0_4_ = 0;
      pEVar2 = nullcDebugFunctionInfo((uint *)&functions);
      pEVar2 = nullcDebugConvertAddressToFunction(functions._4_4_,pEVar2,(uint)functions);
      if (pEVar2 == (ExternFuncInfo *)0x0) {
        uVar1 = *(uint *)(NULLC::linker + 0x750);
      }
      else {
        uVar1 = pEVar2->stackSize;
      }
      instruction = (uVar1 + 0xf & 0xfffffff0) + instruction;
    }
    callStackSize = instruction;
  }
  return callStackSize;
}

Assistant:

unsigned nullcDebugGetReversedStackDataBase(unsigned framePos)
{
	using namespace NULLC;

	unsigned callStackSize = nullcDebugGetStackFrameCount();

	if(framePos > callStackSize)
		return 0;

	unsigned targetFrame = callStackSize - framePos;

	unsigned offset = 0;

	unsigned currentFrame = 0;
	while(unsigned instruction = nullcDebugEnumStackFrame(currentFrame++))
	{
		if(targetFrame == 0)
			return offset;

		targetFrame--;

		unsigned functionCount = 0;
		ExternFuncInfo *functions = nullcDebugFunctionInfo(&functionCount);

		if(ExternFuncInfo *targetFunction = nullcDebugConvertAddressToFunction(instruction, functions, functionCount))
			offset += (targetFunction->stackSize + 0xf) & ~0xf;
		else
			offset += (linker->globalVarSize + 0xf) & ~0xf;
	}

	return offset;
}